

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

void obj_timer_checks(obj *otmp,xchar x,xchar y,int force)

{
  boolean bVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  long age_1;
  long age;
  boolean buried;
  boolean on_floor;
  boolean restart_timer;
  long lStack_20;
  short action;
  long tleft;
  int force_local;
  xchar y_local;
  xchar x_local;
  obj *otmp_local;
  
  lStack_20 = 0;
  age._6_2_ = 1;
  bVar4 = false;
  bVar3 = otmp->where == '\x01';
  if ((otmp->otyp == 0x10e) &&
     (((bVar3 || (otmp->where == '\x05')) &&
      (bVar1 = is_ice(otmp->olev,(int)x,(int)y), bVar1 != '\0')))) {
    lStack_20 = stop_timer(otmp->olev,1,otmp);
    if (lStack_20 == 0) {
      age._6_2_ = 2;
      lStack_20 = stop_timer(otmp->olev,2,otmp);
    }
    bVar4 = lStack_20 != 0;
    if (bVar4) {
      uVar2 = (ulong)moves;
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfff8ffff | 0x10000;
      lStack_20 = (lStack_20 - uVar2) * 2;
      otmp->age = otmp->age * 2 - moves;
    }
  }
  else if ((force < 0) ||
          (((otmp->otyp == 0x10e && ((*(uint *)&otmp->field_0x4a >> 0x10 & 7) != 0)) &&
           (((bVar3 && (bVar1 = is_ice(otmp->olev,(int)x,(int)y), bVar1 == '\0')) || (!bVar3)))))) {
    lStack_20 = stop_timer(otmp->olev,1,otmp);
    if (lStack_20 == 0) {
      age._6_2_ = 2;
      lStack_20 = stop_timer(otmp->olev,2,otmp);
    }
    bVar4 = lStack_20 != 0;
    if (bVar4) {
      uVar2 = (ulong)moves;
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfff8ffff;
      lStack_20 = (long)(lStack_20 - uVar2) / 2;
      otmp->age = otmp->age + (moves - otmp->age) / 2;
    }
  }
  if (bVar4) {
    start_timer(otmp->olev,lStack_20,2,age._6_2_,otmp);
  }
  return;
}

Assistant:

static void obj_timer_checks(struct obj *otmp, xchar x, xchar y,
			     int force)	/* 0 = no force so do checks, <0 = force off, >0 force on */
{
    long tleft = 0L;
    short action = ROT_CORPSE;
    boolean restart_timer = FALSE;
    boolean on_floor = (otmp->where == OBJ_FLOOR);
    boolean buried = (otmp->where == OBJ_BURIED);

    /* Check for corpses just placed on or in ice */
    if (otmp->otyp == CORPSE && (on_floor || buried) && is_ice(otmp->olev,x,y)) {
	tleft = stop_timer(otmp->olev, action, otmp);
	if (tleft == 0L) {
		action = REVIVE_MON;
		tleft = stop_timer(otmp->olev, action, otmp);
	} 
	if (tleft != 0L) {
	    long age;
	    
	    tleft = tleft - moves;
	    /* mark the corpse as being on ice */
	    ON_ICE(otmp) = 1;

	    /* Adjust the time remaining */
	    tleft *= ROT_ICE_ADJUSTMENT;
	    restart_timer = TRUE;
	    /* Adjust the age; must be same as in obj_ice_age() */
	    age = moves - otmp->age;
	    otmp->age = moves - (age * ROT_ICE_ADJUSTMENT);
	}
    }
    /* Check for corpses coming off ice */
    else if ((force < 0) ||
	     (otmp->otyp == CORPSE && ON_ICE(otmp) &&
	     ((on_floor && !is_ice(otmp->olev, x, y)) || !on_floor))) {
	tleft = stop_timer(otmp->olev, action, otmp);
	if (tleft == 0L) {
		action = REVIVE_MON;
		tleft = stop_timer(otmp->olev, action, otmp);
	}
	if (tleft != 0L) {
		long age;

		tleft = tleft - moves;
		ON_ICE(otmp) = 0;

		/* Adjust the remaining time */
		tleft /= ROT_ICE_ADJUSTMENT;
		restart_timer = TRUE;
		/* Adjust the age */
		age = moves - otmp->age;
		otmp->age = otmp->age + (age / ROT_ICE_ADJUSTMENT);
	}
    }
    /* now re-start the timer with the appropriate modifications */ 
    if (restart_timer)
	start_timer(otmp->olev, tleft, TIMER_OBJECT, action, otmp);
}